

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

longdouble * trng::math::detail::inv_erfc<long_double>(longdouble x)

{
  bool bVar1;
  longdouble *plVar2;
  longdouble *extraout_RAX;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar3;
  longdouble in_ST2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  longdouble in_stack_00000008;
  longdouble u_1;
  longdouble e_1;
  longdouble u;
  longdouble e;
  longdouble y;
  bool flag;
  undefined2 in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffc2;
  undefined2 in_stack_ffffffffffffffc8;
  undefined2 uVar5;
  undefined8 uStack_36;
  longdouble local_18;
  undefined7 extraout_var;
  
  local_18 = in_stack_00000008;
  if ((longdouble)1 < in_stack_00000008) {
    local_18 = (longdouble)1 - (in_stack_00000008 - (longdouble)1);
  }
  inv_Phi_approx<long_double>
            ((longdouble)
             CONCAT28(in_stack_ffffffffffffffc8,
                      CONCAT62(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0)));
  in_ST0 = _DAT_0046a770 * in_ST0;
  uVar5 = SUB102(in_ST0,0);
  uStack_36 = (undefined8)((unkuint10)in_ST0 >> 0x10);
  bVar1 = std::isfinite(in_ST0);
  if (bVar1) {
    dVar4 = std::erfc(extraout_XMM0_Qa);
    lVar3 = _DAT_0046a780 * (in_ST1 - local_18);
    std::exp(dVar4);
    lVar3 = lVar3 * in_ST2;
    lVar3 = (longdouble)CONCAT82(uStack_36,uVar5) -
            lVar3 / ((longdouble)1 + (longdouble)CONCAT82(uStack_36,uVar5) * lVar3);
    uVar5 = SUB102(lVar3,0);
    uStack_36 = (undefined8)((unkuint10)lVar3 >> 0x10);
  }
  bVar1 = std::isfinite((longdouble)CONCAT82(uStack_36,uVar5));
  plVar2 = (longdouble *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    dVar4 = std::erfc(extraout_XMM0_Qa_00);
    std::exp(dVar4);
    plVar2 = extraout_RAX;
  }
  return plVar2;
}

Assistant:

TRNG_CUDA_ENABLE T inv_erfc(T x) {
        // step size in the Halley step is proportional to erfc, use symmetry to increase
        // numerical accuracy
        const bool flag{x > 1};
        if (flag)
          x = -(x - 1) + 1;
        T y{-inv_Phi_approx(x / 2) * constants<T>::one_over_sqrt_2};
        // refinement by Halley rational method
        if (isfinite(y)) {
          const T e{erfc(y) - x};
          const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
          y -= u / (1 + y * u);
        }
        // T is a floating point number type with more than 80 bits, a 2nd iteration is
        // required to reach full machine precision
#if __cplusplus >= 201703L
        if constexpr (sizeof(T) > 10) {
#else
#if _MSC_VER
#pragma warning(push)
#pragma warning(disable : 4127)
#endif
        if (sizeof(T) > 10) {
#if _MSC_VER
#pragma warning(pop)
#endif
#endif
          if (isfinite(y)) {
            const T e{erfc(y) - x};
            const T u{-e * (constants<T>::sqrt_pi_over_2) * exp(y * y)};
            y -= u / (1 + y * u);
          }
        }
        return flag ? -y : y;
      }

    }